

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::InsertHashes
          (JoinHashTable *this,Vector *hashes_v,idx_t count,TupleDataChunkState *chunk_state,
          InsertState *insert_state,bool parallel)

{
  byte bVar1;
  ht_entry_t *phVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  sel_t *psVar6;
  long lVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  bool bVar10;
  const_reference cVar11;
  idx_t i_3;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t iVar15;
  idx_t iVar16;
  ulong uVar17;
  ulong uVar18;
  idx_t iVar19;
  undefined7 in_register_00000089;
  ulong uVar20;
  idx_t local_138;
  SelectionVector *local_130;
  idx_t local_128;
  idx_t local_120;
  idx_t local_e8;
  vector<bool,_true> *local_e0;
  type local_d8;
  ulong local_d0;
  data_ptr_t local_c8;
  idx_t key_no_match_count;
  undefined8 local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  idx_t local_a8;
  idx_t count_local;
  Vector row_locations;
  
  phVar2 = this->entries;
  count_local = count;
  Vector::Vector(&row_locations,&chunk_state->row_locations);
  local_138 = count;
  local_128 = count;
  if ((int)CONCAT71(in_register_00000089,parallel) == 0) {
    local_d8 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator*(&this->data_collection);
    ApplyBitmaskAndGetSaltBuild
              (hashes_v,&(insert_state->super_SharedState).salt_v,&count_local,&this->bitmask);
    pdVar3 = hashes_v->data;
    local_c8 = (insert_state->super_SharedState).rhs_row_locations.data;
    pdVar4 = (insert_state->super_SharedState).salt_v.data;
    local_130 = FlatVector::IncrementalSelectionVector();
    bVar10 = PropagatesBuildSide(this->join_type);
    if (bVar10) {
      local_e0 = &this->null_values_are_equal;
      for (uVar20 = 0;
          uVar20 < (ulong)(((long)(this->conditions->
                                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  ).
                                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->conditions->
                                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 ).
                                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar20 = uVar20 + 1) {
        cVar11 = vector<bool,_true>::get<true>(local_e0,uVar20);
        if (!cVar11) {
          local_d0 = uVar20 >> 3;
          local_120 = 0;
          for (uVar18 = 0; local_128 != uVar18; uVar18 = uVar18 + 1) {
            uVar12 = uVar18;
            if (local_130->sel_vector != (sel_t *)0x0) {
              uVar12 = (ulong)local_130->sel_vector[uVar18];
            }
            key_no_match_count = *(idx_t *)(row_locations.data + uVar12 * 8);
            local_b8 = 0;
            _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar1 = *(byte *)(key_no_match_count + local_d0);
            local_a8 = count;
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
            if ((1 << ((byte)uVar20 & 7) & (uint)bVar1) != 0) {
              (insert_state->remaining_sel).sel_vector[local_120] = (sel_t)uVar12;
              local_120 = local_120 + 1;
            }
          }
          local_128 = local_120;
          local_130 = &insert_state->remaining_sel;
        }
      }
      local_138 = local_128;
    }
    uVar20 = this->bitmask | 0xffff000000000000;
    while (local_138 != 0) {
      iVar15 = 0;
      for (uVar18 = 0; uVar18 != local_138; uVar18 = uVar18 + 1) {
        uVar12 = uVar18;
        if (local_130->sel_vector != (sel_t *)0x0) {
          uVar12 = (ulong)local_130->sel_vector[uVar18];
        }
        uVar17 = *(ulong *)(pdVar3 + uVar12 * 8);
        while (uVar13 = phVar2[uVar17].value, uVar13 != 0) {
          if ((uVar13 | 0xffffffffffff) == *(ulong *)(pdVar4 + uVar12 * 8)) {
            (insert_state->super_SharedState).salt_match_sel.sel_vector[iVar15] = (sel_t)uVar12;
            *(ulong *)(local_c8 + iVar15 * 8) = uVar13 & 0xffffffffffff;
            iVar15 = iVar15 + 1;
            goto LAB_0141dd12;
          }
          uVar17 = uVar17 + 1 & uVar20;
          *(ulong *)(pdVar3 + uVar12 * 8) = uVar17;
        }
        uVar13 = *(ulong *)(row_locations.data + uVar12 * 8);
        uVar12 = *(ulong *)(pdVar4 + uVar12 * 8);
        *(hash_t *)(uVar13 + this->pointer_offset) = phVar2[uVar17].value & 0xffffffffffff;
        LOCK();
        phVar2[uVar17].value = uVar12 & 0xffff000000000000 | uVar13;
        UNLOCK();
LAB_0141dd12:
      }
      key_no_match_count = 0;
      local_138 = key_no_match_count;
      local_130 = &insert_state->remaining_sel;
      if (iVar15 != 0) {
        local_e8 = 0;
        PerformKeyComparison
                  (insert_state,this,local_d8,&row_locations,iVar15,&local_e8,&key_no_match_count);
        if (local_e8 != 0) {
          this->chains_longer_than_one = true;
        }
        for (uVar18 = 0; local_e8 != uVar18; uVar18 = uVar18 + 1) {
          psVar6 = (insert_state->key_match_sel).sel_vector;
          uVar12 = uVar18;
          if (psVar6 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar6[uVar18];
          }
          psVar6 = (insert_state->super_SharedState).salt_match_sel.sel_vector;
          if (psVar6 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar6[uVar12];
          }
          lVar7 = *(long *)(pdVar3 + uVar12 * 8);
          uVar17 = *(ulong *)(row_locations.data + uVar12 * 8);
          uVar12 = *(ulong *)(pdVar4 + uVar12 * 8);
          *(hash_t *)(uVar17 + this->pointer_offset) = phVar2[lVar7].value & 0xffffffffffff;
          LOCK();
          phVar2[lVar7].value = uVar12 & 0xffff000000000000 | uVar17;
          UNLOCK();
        }
        psVar6 = (insert_state->super_SharedState).salt_match_sel.sel_vector;
        psVar8 = (insert_state->super_SharedState).key_no_match_sel.sel_vector;
        psVar9 = (insert_state->remaining_sel).sel_vector;
        for (uVar18 = 0; local_138 = key_no_match_count, key_no_match_count != uVar18;
            uVar18 = uVar18 + 1) {
          uVar12 = uVar18;
          if (psVar8 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar8[uVar18];
          }
          if (psVar6 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar6[uVar12];
          }
          *(ulong *)(pdVar3 + uVar12 * 8) = *(long *)(pdVar3 + uVar12 * 8) + 1U & uVar20;
          psVar9[uVar18] = (sel_t)uVar12;
        }
      }
    }
  }
  else {
    local_d8 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator*(&this->data_collection);
    ApplyBitmaskAndGetSaltBuild
              (hashes_v,&(insert_state->super_SharedState).salt_v,&count_local,&this->bitmask);
    pdVar3 = hashes_v->data;
    pdVar4 = (insert_state->super_SharedState).rhs_row_locations.data;
    pdVar5 = (insert_state->super_SharedState).salt_v.data;
    local_130 = FlatVector::IncrementalSelectionVector();
    bVar10 = PropagatesBuildSide(this->join_type);
    if (bVar10) {
      local_e0 = &this->null_values_are_equal;
      for (uVar20 = 0;
          uVar20 < (ulong)(((long)(this->conditions->
                                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  ).
                                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->conditions->
                                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 ).
                                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar20 = uVar20 + 1) {
        cVar11 = vector<bool,_true>::get<true>(local_e0,uVar20);
        if (!cVar11) {
          local_d0 = uVar20 >> 3;
          local_120 = 0;
          for (iVar15 = 0; local_128 != iVar15; iVar15 = iVar15 + 1) {
            iVar19 = iVar15;
            if (local_130->sel_vector != (sel_t *)0x0) {
              iVar19 = (idx_t)local_130->sel_vector[iVar15];
            }
            key_no_match_count = *(idx_t *)(row_locations.data + iVar19 * 8);
            local_b8 = 0;
            _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_c8 = (data_ptr_t)
                       CONCAT44(local_c8._4_4_,(uint)*(byte *)(key_no_match_count + local_d0));
            local_a8 = count;
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
            if ((1 << ((byte)uVar20 & 7) & (uint)local_c8) != 0) {
              (insert_state->remaining_sel).sel_vector[local_120] = (sel_t)iVar19;
              local_120 = local_120 + 1;
            }
          }
          local_128 = local_120;
          local_130 = &insert_state->remaining_sel;
        }
      }
      local_138 = local_128;
    }
    uVar20 = this->bitmask | 0xffff000000000000;
    while (local_138 != 0) {
      iVar19 = 0;
      for (iVar15 = 0; iVar15 != local_138; iVar15 = iVar15 + 1) {
        iVar16 = iVar15;
        if (local_130->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)local_130->sel_vector[iVar15];
        }
        uVar18 = *(ulong *)(pdVar3 + iVar16 * 8);
        while( true ) {
          uVar12 = phVar2[uVar18].value;
          if (uVar12 == 0) break;
          if ((uVar12 | 0xffffffffffff) == *(ulong *)(pdVar5 + iVar16 * 8)) {
            (insert_state->super_SharedState).salt_match_sel.sel_vector[iVar19] = (sel_t)iVar16;
            uVar12 = uVar12 & 0xffffffffffff;
            goto LAB_0141dada;
          }
          uVar18 = uVar18 + 1 & uVar20;
          *(ulong *)(pdVar3 + iVar16 * 8) = uVar18;
        }
        uVar17 = *(ulong *)(row_locations.data + iVar16 * 8);
        uVar13 = *(ulong *)(pdVar5 + iVar16 * 8);
        *(undefined8 *)(uVar17 + this->pointer_offset) = 0;
        LOCK();
        uVar12 = phVar2[uVar18].value;
        if (uVar12 == 0) {
          phVar2[uVar18].value = uVar13 & 0xffff000000000000 | uVar17;
          uVar12 = 0;
        }
        UNLOCK();
        uVar12 = uVar12 & 0xffffffffffff;
        if (uVar12 != 0) {
          (insert_state->super_SharedState).salt_match_sel.sel_vector[iVar19] = (sel_t)iVar16;
LAB_0141dada:
          *(ulong *)(pdVar4 + iVar19 * 8) = uVar12;
          iVar19 = iVar19 + 1;
        }
      }
      key_no_match_count = 0;
      local_138 = key_no_match_count;
      local_130 = &insert_state->remaining_sel;
      if (iVar19 != 0) {
        local_e8 = 0;
        PerformKeyComparison
                  (insert_state,this,local_d8,&row_locations,iVar19,&local_e8,&key_no_match_count);
        if (local_e8 != 0) {
          this->chains_longer_than_one = true;
        }
        for (uVar18 = 0; uVar18 != local_e8; uVar18 = uVar18 + 1) {
          psVar6 = (insert_state->key_match_sel).sel_vector;
          uVar12 = uVar18;
          if (psVar6 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar6[uVar18];
          }
          psVar6 = (insert_state->super_SharedState).salt_match_sel.sel_vector;
          if (psVar6 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar6[uVar12];
          }
          lVar7 = *(long *)(pdVar3 + uVar12 * 8);
          uVar17 = *(ulong *)(row_locations.data + uVar12 * 8);
          uVar12 = *(ulong *)(pdVar5 + uVar12 * 8);
          uVar13 = phVar2[lVar7].value;
          do {
            *(ulong *)(uVar17 + this->pointer_offset) = uVar13 & 0xffffffffffff;
            LOCK();
            uVar14 = phVar2[lVar7].value;
            bVar10 = uVar13 == uVar14;
            if (bVar10) {
              phVar2[lVar7].value = uVar12 & 0xffff000000000000 | uVar17;
              uVar14 = uVar13;
            }
            UNLOCK();
            uVar13 = uVar14;
          } while (!bVar10);
        }
        psVar6 = (insert_state->super_SharedState).salt_match_sel.sel_vector;
        psVar8 = (insert_state->super_SharedState).key_no_match_sel.sel_vector;
        psVar9 = (insert_state->remaining_sel).sel_vector;
        for (uVar18 = 0; local_138 = key_no_match_count, key_no_match_count != uVar18;
            uVar18 = uVar18 + 1) {
          uVar12 = uVar18;
          if (psVar8 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar8[uVar18];
          }
          if (psVar6 != (sel_t *)0x0) {
            uVar12 = (ulong)psVar6[uVar12];
          }
          *(ulong *)(pdVar3 + uVar12 * 8) = *(long *)(pdVar3 + uVar12 * 8) + 1U & uVar20;
          psVar9[uVar18] = (sel_t)uVar12;
        }
      }
    }
  }
  Vector::~Vector(&row_locations);
  return;
}

Assistant:

void JoinHashTable::InsertHashes(Vector &hashes_v, const idx_t count, TupleDataChunkState &chunk_state,
                                 InsertState &insert_state, bool parallel) {
	auto atomic_entries = reinterpret_cast<atomic<ht_entry_t> *>(this->entries);
	auto row_locations = chunk_state.row_locations;
	if (parallel) {
		InsertHashesLoop<true>(atomic_entries, row_locations, hashes_v, count, insert_state, *data_collection, *this);
	} else {
		InsertHashesLoop<false>(atomic_entries, row_locations, hashes_v, count, insert_state, *data_collection, *this);
	}
}